

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::TiledOutputFile::Data::Data(Data *this,int numThreads)

{
  undefined4 in_ESI;
  long in_RDI;
  size_type __new_size;
  vector<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
  *this_00;
  long lVar1;
  LevelMode r;
  float in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  float in_stack_ffffffffffffffe4;
  int in_stack_ffffffffffffffe8;
  float in_stack_ffffffffffffffec;
  float in_stack_fffffffffffffff0;
  
  lVar1 = in_RDI;
  Imath_3_2::Vec2<float>::Vec2((Vec2<float> *)&stack0xffffffffffffffec,0.0,0.0);
  r = ONE_LEVEL;
  Header::Header((Header *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)in_stack_ffffffffffffffec
                 ,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                 (V2f *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 in_stack_ffffffffffffffd4,INCREASING_Y,(Compression)((ulong)lVar1 >> 0x20));
  *(undefined1 *)(lVar1 + 0x3c) = 0;
  TileDescription::TileDescription((TileDescription *)(lVar1 + 0x40),0x20,0x20,r,r);
  FrameBuffer::FrameBuffer((FrameBuffer *)0x23f7bf);
  *(undefined8 *)(in_RDI + 0xa8) = 0;
  *(undefined8 *)(in_RDI + 0xb0) = 0;
  TileOffsets::TileOffsets
            ((TileOffsets *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (LevelMode)in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
             (int)in_stack_ffffffffffffffe4,
             (int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (int *)CONCAT44(in_stack_ffffffffffffffd4,r));
  std::
  vector<Imf_3_4::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo>_>
  ::vector((vector<Imf_3_4::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo>_>
            *)0x23f80f);
  __new_size = in_RDI + 0x108;
  std::
  vector<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
  ::vector((vector<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
            *)0x23f825);
  *(undefined8 *)(in_RDI + 0x128) = 0;
  this_00 = (vector<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
             *)(in_RDI + 0x130);
  std::
  map<Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
  ::map((map<Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
         *)0x23f846);
  anon_unknown_5::TileCoord::TileCoord((TileCoord *)(in_RDI + 0x160),0,0,0,0);
  *(undefined4 *)(in_RDI + 0x170) = 0xffffffff;
  std::max<int>((int *)&stack0xffffffffffffffd8,(int *)&stack0xffffffffffffffd4);
  std::
  vector<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
  ::resize(this_00,__new_size);
  return;
}

Assistant:

TiledOutputFile::Data::Data (int numThreads)
    : multipart (false)
    , numXTiles (0)
    , numYTiles (0)
    , tileOffsetsPosition (0)
    , partNumber (-1)
{
    //
    // We need at least one tileBuffer, but if threading is used,
    // to keep n threads busy we need 2*n tileBuffers
    //

    tileBuffers.resize (max (1, 2 * numThreads));
}